

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void xatlas::internal::insertionSort<unsigned_int>(uint *data,uint32_t length)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 1;
  do {
    if ((int)length <= lVar2) {
      return;
    }
    uVar1 = data[lVar2];
    for (lVar3 = lVar2; 0 < lVar3; lVar3 = lVar3 + -1) {
      if (data[lVar3 + -1] <= uVar1) goto LAB_00196e8d;
      data[lVar3] = data[lVar3 + -1];
    }
    lVar3 = 0;
LAB_00196e8d:
    data[(int)lVar3] = uVar1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static void insertionSort(T *data, uint32_t length)
{
	for (int32_t i = 1; i < (int32_t)length; i++) {
		T x = data[i];
		int32_t j = i - 1;
		while (j >= 0 && x < data[j]) {
			data[j + 1] = data[j];
			j--;
		}
		data[j + 1] = x;
	}
}